

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::
~ExpressionStackWalker
          (ExpressionStackWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_> *this)

{
  pointer this_00;
  size_t __n;
  
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&(this->expressionStack).flexible.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>);
  this_00 = (this->super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>).
            super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
  ::_M_deallocate((_Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
                   *)this_00,
                  (pointer)((long)*(pointer *)
                                   ((long)&(this->
                                           super_PostWalker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                                           ).
                                           super_Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>
                                           .stack.flexible.
                                           super__Vector_base<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task,_std::allocator<wasm::Walker<RefinementScanner,_wasm::Visitor<RefinementScanner,_void>_>::Task>_>
                                           ._M_impl.super__Vector_impl_data + 0x10) - (long)this_00
                           >> 4),__n);
  return;
}

Assistant:

ExpressionStackWalker() = default;